

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

GLuint gl3cts::TransformFeedback::Utilities::buildProgram
                 (Functions *gl,TestLog *log,GLchar *geometry_shader_source,
                 GLchar *tessellation_control_shader_source,
                 GLchar *tessellation_evaluation_shader_source,GLchar *vertex_shader_source,
                 GLchar *fragment_shader_source,GLchar **transform_feedback_varyings,
                 GLsizei transform_feedback_varyings_count,GLenum transform_feedback_varyings_mode,
                 bool do_not_detach,GLint *linking_status)

{
  long lVar1;
  GLuint GVar2;
  GLenum GVar3;
  GLuint GVar4;
  MessageBuilder *pMVar5;
  undefined4 *puVar6;
  Enum<int,_2UL> EVar7;
  uint local_3fc;
  undefined1 local_3f8 [4];
  GLuint i_2;
  GLchar *local_278;
  GLchar *log_text_1;
  uint local_268;
  GLint log_size_1;
  GLuint i_1;
  GLint status;
  int local_258;
  Enum<int,_2UL> local_250;
  MessageBuilder local_240;
  GLchar *local_c0;
  GLchar *log_text;
  GLint log_size;
  GLint status_1;
  GLuint i;
  undefined4 local_9c;
  GLchar *pGStack_98;
  GLuint shader_count;
  Shader shader [5];
  GLuint program;
  bool do_not_detach_local;
  GLchar *vertex_shader_source_local;
  GLchar *tessellation_evaluation_shader_source_local;
  GLchar *tessellation_control_shader_source_local;
  GLchar *geometry_shader_source_local;
  TestLog *log_local;
  Functions *gl_local;
  
  shader[0].source._0_4_ = 0x8dd9;
  shader[0].source._4_4_ = 0;
  shader[1].source._0_4_ = 0x8e88;
  shader[1].source._4_4_ = 0;
  shader[2].source._0_4_ = 0x8e87;
  shader[2].source._4_4_ = 0;
  shader[3].source._0_4_ = 0x8b31;
  shader[3].source._4_4_ = 0;
  shader[3]._8_8_ = fragment_shader_source;
  shader[4].source._0_4_ = 0x8b30;
  shader[4].source._4_4_ = 0;
  local_9c = 5;
  pGStack_98 = geometry_shader_source;
  shader[0]._8_8_ = tessellation_control_shader_source;
  shader[1]._8_8_ = tessellation_evaluation_shader_source;
  shader[2]._8_8_ = vertex_shader_source;
  GVar2 = (*gl->createProgram)();
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glCreateProgram call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1a24);
  for (log_size = 0; (uint)log_size < 5; log_size = log_size + 1) {
    lVar1._0_4_ = shader[(ulong)(uint)log_size - 1].type;
    lVar1._4_4_ = shader[(ulong)(uint)log_size - 1].id;
    if (lVar1 != 0) {
      GVar4 = (*gl->createShader)(*(GLenum *)&shader[(uint)log_size].source);
      *(GLuint *)((long)&shader[(uint)log_size].source + 4) = GVar4;
      GVar3 = (*gl->getError)();
      glu::checkError(GVar3,"glCreateShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x1a2e);
      (*gl->attachShader)(GVar2,*(GLuint *)((long)&shader[(uint)log_size].source + 4));
      GVar3 = (*gl->getError)();
      glu::checkError(GVar3,"glAttachShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x1a32);
      (*gl->shaderSource)(*(GLuint *)((long)&shader[(uint)log_size].source + 4),1,
                          (GLchar **)&shader[(ulong)(uint)log_size - 1].type,(GLint *)0x0);
      GVar3 = (*gl->getError)();
      glu::checkError(GVar3,"glShaderSource call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x1a36);
      (*gl->compileShader)(*(GLuint *)((long)&shader[(uint)log_size].source + 4));
      GVar3 = (*gl->getError)();
      glu::checkError(GVar3,"glCompileShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x1a3a);
      log_text._4_4_ = 0;
      (*gl->getShaderiv)(*(GLuint *)((long)&shader[(uint)log_size].source + 4),0x8b81,
                         (GLint *)((long)&log_text + 4));
      GVar3 = (*gl->getError)();
      glu::checkError(GVar3,"glGetShaderiv call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x1a3f);
      if (log_text._4_4_ == 0) {
        log_text._0_4_ = 0;
        (*gl->getShaderiv)(*(GLuint *)((long)&shader[(uint)log_size].source + 4),0x8b84,
                           (GLint *)&log_text);
        GVar3 = (*gl->getError)();
        glu::checkError(GVar3,"glGetShaderiv call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                        ,0x1a45);
        local_c0 = (GLchar *)operator_new__((long)(int)log_text);
        (*gl->getShaderInfoLog)
                  (*(GLuint *)((long)&shader[(uint)log_size].source + 4),(int)log_text,
                   (GLsizei *)0x0,local_c0);
        tcu::TestLog::operator<<(&local_240,log,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (&local_240,(char (*) [32])"Shader compilation has failed.\n");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [14])"Shader type: ");
        EVar7 = glu::getShaderTypeStr(*(int *)&shader[(uint)log_size].source);
        _i_1 = EVar7.m_getName;
        local_258 = EVar7.m_value;
        local_250.m_getName = _i_1;
        local_250.m_value = local_258;
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_250);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b8f97b);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (pMVar5,(char (*) [31])"Shader compilation error log:\n");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_c0);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b8f97b);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [21])"Shader source code:\n");
        pMVar5 = tcu::MessageBuilder::operator<<
                           (pMVar5,(char **)&shader[(ulong)(uint)log_size - 1].type);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b8f97b);
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_240);
        if (local_c0 != (GLchar *)0x0) {
          operator_delete__(local_c0);
        }
        GVar3 = (*gl->getError)();
        glu::checkError(GVar3,"glGetShaderInfoLog call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                        ,0x1a55);
        puVar6 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar6 = 0;
        __cxa_throw(puVar6,&int::typeinfo,0);
      }
    }
  }
  if (transform_feedback_varyings_count != 0) {
    (*gl->transformFeedbackVaryings)
              (GVar2,transform_feedback_varyings_count,transform_feedback_varyings,
               transform_feedback_varyings_mode);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"glTransformFeedbackVaryings call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0x1a61);
  }
  (*gl->linkProgram)(GVar2);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glTransformFeedbackVaryings call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1a66);
  log_size_1 = 0;
  (*gl->getProgramiv)(GVar2,0x8b82,&log_size_1);
  if (linking_status != (GLint *)0x0) {
    *linking_status = log_size_1;
  }
  if (log_size_1 != 1) {
    log_text_1._4_4_ = 0;
    (*gl->getProgramiv)(GVar2,0x8b84,(GLint *)((long)&log_text_1 + 4));
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"glGetProgramiv call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0x1a86);
    local_278 = (GLchar *)operator_new__((long)log_text_1._4_4_);
    (*gl->getProgramInfoLog)(GVar2,log_text_1._4_4_,(GLsizei *)0x0,local_278);
    tcu::TestLog::operator<<
              ((MessageBuilder *)local_3f8,log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_3f8,
                        (char (*) [36])"Program linkage has failed due to:\n");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_278);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b8f97b);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_3f8);
    if (local_278 != (GLchar *)0x0) {
      operator_delete__(local_278);
    }
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"glGetProgramInfoLog call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0x1a92);
    puVar6 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar6 = 0;
    __cxa_throw(puVar6,&int::typeinfo,0);
  }
  if (!do_not_detach) {
    for (local_268 = 0; local_268 < 5; local_268 = local_268 + 1) {
      if (*(int *)((long)&shader[local_268].source + 4) != 0) {
        (*gl->detachShader)(GVar2,*(GLuint *)((long)&shader[local_268].source + 4));
        GVar3 = (*gl->getError)();
        glu::checkError(GVar3,"glDetachShader call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                        ,0x1a7b);
      }
    }
  }
  for (local_3fc = 0; local_3fc < 5; local_3fc = local_3fc + 1) {
    if (*(int *)((long)&shader[local_3fc].source + 4) != 0) {
      (*gl->deleteShader)(*(GLuint *)((long)&shader[local_3fc].source + 4));
      *(undefined4 *)((long)&shader[local_3fc].source + 4) = 0;
    }
  }
  return GVar2;
}

Assistant:

glw::GLuint gl3cts::TransformFeedback::Utilities::buildProgram(
	glw::Functions const& gl, tcu::TestLog& log, glw::GLchar const* const geometry_shader_source,
	glw::GLchar const* const tessellation_control_shader_source,
	glw::GLchar const* const tessellation_evaluation_shader_source, glw::GLchar const* const vertex_shader_source,
	glw::GLchar const* const fragment_shader_source, glw::GLchar const* const* const transform_feedback_varyings,
	glw::GLsizei const transform_feedback_varyings_count, glw::GLenum const transform_feedback_varyings_mode,
	bool const do_not_detach, glw::GLint* linking_status)
{
	glw::GLuint program = 0;

	struct Shader
	{
		glw::GLchar const* const source;
		glw::GLenum const		 type;
		glw::GLuint				 id;
	} shader[] = { { geometry_shader_source, GL_GEOMETRY_SHADER, 0 },
				   { tessellation_control_shader_source, GL_TESS_CONTROL_SHADER, 0 },
				   { tessellation_evaluation_shader_source, GL_TESS_EVALUATION_SHADER, 0 },
				   { vertex_shader_source, GL_VERTEX_SHADER, 0 },
				   { fragment_shader_source, GL_FRAGMENT_SHADER, 0 } };

	glw::GLuint const shader_count = sizeof(shader) / sizeof(shader[0]);

	try
	{
		/* Create program. */
		program = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram call failed.");

		/* Shader compilation. */

		for (glw::GLuint i = 0; i < shader_count; ++i)
		{
			if (DE_NULL != shader[i].source)
			{
				shader[i].id = gl.createShader(shader[i].type);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader call failed.");

				gl.attachShader(program, shader[i].id);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader call failed.");

				gl.shaderSource(shader[i].id, 1, &(shader[i].source), NULL);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource call failed.");

				gl.compileShader(shader[i].id);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader call failed.");

				glw::GLint status = GL_FALSE;

				gl.getShaderiv(shader[i].id, GL_COMPILE_STATUS, &status);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv call failed.");

				if (GL_FALSE == status)
				{
					glw::GLint log_size = 0;
					gl.getShaderiv(shader[i].id, GL_INFO_LOG_LENGTH, &log_size);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv call failed.");

					glw::GLchar* log_text = new glw::GLchar[log_size];

					gl.getShaderInfoLog(shader[i].id, log_size, NULL, &log_text[0]);

					log << tcu::TestLog::Message << "Shader compilation has failed.\n"
						<< "Shader type: " << glu::getShaderTypeStr(shader[i].type) << "\n"
						<< "Shader compilation error log:\n"
						<< log_text << "\n"
						<< "Shader source code:\n"
						<< shader[i].source << "\n"
						<< tcu::TestLog::EndMessage;

					delete[] log_text;

					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderInfoLog call failed.");

					throw 0;
				}
			}
		}

		/* Link. */
		if (transform_feedback_varyings_count)
		{
			gl.transformFeedbackVaryings(program, transform_feedback_varyings_count, transform_feedback_varyings,
										 transform_feedback_varyings_mode);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings call failed.");
		}

		gl.linkProgram(program);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings call failed.");

		glw::GLint status = GL_FALSE;

		gl.getProgramiv(program, GL_LINK_STATUS, &status);

		if (DE_NULL != linking_status)
		{
			*linking_status = status;
		}

		if (GL_TRUE == status)
		{
			if (!do_not_detach)
			{
				for (glw::GLuint i = 0; i < shader_count; ++i)
				{
					if (shader[i].id)
					{
						gl.detachShader(program, shader[i].id);

						GLU_EXPECT_NO_ERROR(gl.getError(), "glDetachShader call failed.");
					}
				}
			}
		}
		else
		{
			glw::GLint log_size = 0;

			gl.getProgramiv(program, GL_INFO_LOG_LENGTH, &log_size);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv call failed.");

			glw::GLchar* log_text = new glw::GLchar[log_size];

			gl.getProgramInfoLog(program, log_size, NULL, &log_text[0]);

			log << tcu::TestLog::Message << "Program linkage has failed due to:\n"
				<< log_text << "\n"
				<< tcu::TestLog::EndMessage;

			delete[] log_text;

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramInfoLog call failed.");

			throw 0;
		}
	}
	catch (...)
	{
		if (program)
		{
			gl.deleteProgram(program);

			program = 0;
		}
	}

	for (glw::GLuint i = 0; i < shader_count; ++i)
	{
		if (0 != shader[i].id)
		{
			gl.deleteShader(shader[i].id);

			shader[i].id = 0;
		}
	}

	return program;
}